

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall network_pimpl::remove_event(network_pimpl *this,EventDataType *value)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  pointer this_00;
  bool bVar5;
  string local_b8;
  string local_98;
  string local_78;
  vector<EventDataType,_std::allocator<EventDataType>_> *local_58;
  string local_50;
  
  this_00 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = &this->events;
    lVar4 = -(long)this_00;
    do {
      EventDataType::getName_abi_cxx11_(&local_98,this_00);
      EventDataType::getName_abi_cxx11_(&local_b8,value);
      if ((local_98._M_string_length == local_b8._M_string_length) &&
         ((local_98._M_string_length == 0 ||
          (iVar2 = bcmp(local_98._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                        local_98._M_string_length), iVar2 == 0)))) {
        EventDataType::getOrigin_abi_cxx11_(&local_78,this_00);
        EventDataType::getOrigin_abi_cxx11_(&local_50,value);
        _Var1._M_p = local_50._M_dataplus._M_p;
        if (local_78._M_string_length == local_50._M_string_length) {
          if (local_78._M_string_length == 0) {
            bVar5 = true;
          }
          else {
            iVar2 = bcmp(local_78._M_dataplus._M_p,local_50._M_dataplus._M_p,
                         local_78._M_string_length);
            bVar5 = iVar2 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var1._M_p != &local_50.field_2) {
          operator_delete(_Var1._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::vector<EventDataType,_std::allocator<EventDataType>_>::_M_erase
                  (local_58,(EventDataType *)-lVar4);
        return;
      }
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -0x48;
    } while (this_00 !=
             (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"---could not find event to delete. name: ",0x29);
  EventDataType::getName_abi_cxx11_(&local_98,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," origin: ",9);
  EventDataType::getOrigin_abi_cxx11_(&local_b8,value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void network_pimpl::remove_event(const EventDataType &value){
    for(auto it = events.begin(); it != events.end(); ++it){
        if(it->getName() == value.getName() && it->getOrigin() == value.getOrigin()){
            events.erase(it);
            return;
        }
    }
    std::cerr << "---could not find event to delete. name: " << value.getName() << " origin: " << value.getOrigin() << "\n";
}